

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int lj_cf_rawlen(lua_State *L)

{
  int iVar1;
  lua_State *L_00;
  MSize MVar2;
  GCtab *in_RDI;
  int32_t len;
  cTValue *o;
  int in_stack_ffffffffffffffdc;
  
  L_00 = *(lua_State **)&in_RDI->metatable;
  if ((L_00 < *(lua_State **)&in_RDI->asize) &&
     (iVar1._0_1_ = L_00->marked, iVar1._1_1_ = L_00->gct, iVar1._2_1_ = L_00->dummy_ffid,
     iVar1._3_1_ = L_00->status, iVar1 == -5)) {
    MVar2 = *(MSize *)((ulong)(L_00->nextgc).gcptr32 + 0xc);
  }
  else {
    lj_lib_checktab(L_00,in_stack_ffffffffffffffdc);
    MVar2 = lj_tab_len(in_RDI);
  }
  *(double *)(*(long *)&in_RDI->asize + -8) = (double)(int)MVar2;
  return 1;
}

Assistant:

LJLIB_CF(rawlen)		LJLIB_REC(.)
{
  cTValue *o = L->base;
  int32_t len;
  if (L->top > o && tvisstr(o))
    len = (int32_t)strV(o)->len;
  else
    len = (int32_t)lj_tab_len(lj_lib_checktab(L, 1));
  setintV(L->top-1, len);
  return 1;
}